

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_glossary_gnu_ds(arg_dstr_t ds,void **argtable)

{
  char *__s;
  ushort *puVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  ulong uVar12;
  char syntax [200];
  char *in_stack_fffffffffffffee8;
  uint local_f8;
  undefined1 local_f4;
  
  pbVar10 = (byte *)*argtable;
  if ((*pbVar10 & 1) == 0) {
    lVar6 = 0;
    do {
      if (*(long *)(pbVar10 + 0x20) != 0) {
        memset(&local_f8,0,200);
        if (*(char **)(pbVar10 + 0x10) != (char *)0x0 && *(size_t *)(pbVar10 + 8) == 0) {
          local_f8 = 0x20202020;
          local_f4 = 0;
        }
        __s = *(char **)(pbVar10 + 0x20);
        arg_cat_optionv((char *)&local_f8,*(size_t *)(pbVar10 + 8),*(char **)(pbVar10 + 0x10),
                        *(char **)(pbVar10 + 0x18),(char *)(ulong)(*pbVar10 & 4),0x112a24,
                        in_stack_fffffffffffffee8);
        sVar3 = strlen((char *)&local_f8);
        if (0x19 < sVar3) {
          arg_dstr_catf(ds,"  %-25s %s\n",&local_f8,"");
          local_f8 = local_f8 & 0xffffff00;
        }
        arg_dstr_catf(ds,"  %-25s ",&local_f8);
        pcVar4 = (char *)strlen(__s);
        if ((char *)0xfffffffe < pcVar4) {
          __assert_fail("strlen(text) < UINT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/argtable3/src/argtable3.c"
                        ,899,
                        "void arg_print_formatted_ds(arg_dstr_t, const unsigned int, const unsigned int, const char *)"
                       );
        }
        if ((int)pcVar4 != 0) {
          uVar8 = 0;
          ppuVar5 = __ctype_b_loc();
          uVar12 = (ulong)pcVar4 & 0xffffffff;
          in_stack_fffffffffffffee8 = pcVar4;
          do {
            puVar1 = *ppuVar5;
            uVar8 = (ulong)((int)uVar8 - 1);
            do {
              iVar9 = (int)uVar8;
              uVar7 = iVar9 + 1;
              uVar8 = (ulong)uVar7;
            } while ((*(byte *)((long)puVar1 + (long)__s[uVar8] * 2 + 1) & 0x20) != 0);
            if (0x34 < (int)uVar12 - uVar7) {
              uVar11 = iVar9 + 0x35;
              uVar2 = uVar11;
              if (uVar7 < 0xffffffcc) {
                uVar11 = iVar9 + 0x35;
                do {
                  uVar2 = uVar11;
                  if ((*(byte *)((long)puVar1 + (long)__s[uVar11] * 2 + 1) & 0x20) != 0) break;
                  uVar11 = uVar11 - 1;
                  uVar2 = uVar11;
                } while (uVar7 < uVar11);
              }
              while ((uVar7 < uVar2 &&
                     (uVar11 = uVar2,
                     (*(byte *)((long)puVar1 + (long)__s[uVar2] * 2 + 1) & 0x20) != 0))) {
                uVar11 = uVar7;
                uVar2 = uVar2 - 1;
              }
              uVar12 = (ulong)(uVar11 + 1);
            }
            if (uVar7 < (uint)uVar12) {
              do {
                pcVar4 = in_stack_fffffffffffffee8;
                arg_dstr_catc(ds,__s[uVar8]);
                uVar8 = uVar8 + 1;
                in_stack_fffffffffffffee8 = pcVar4;
              } while (uVar8 < uVar12);
            }
            arg_dstr_cat(ds,"\n");
            if ((uint)uVar12 < (uint)pcVar4) {
              iVar9 = 0x1c;
              pcVar4 = in_stack_fffffffffffffee8;
              do {
                arg_dstr_cat(ds," ");
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
              uVar12 = (ulong)pcVar4 & 0xffffffff;
              in_stack_fffffffffffffee8 = pcVar4;
            }
          } while ((uint)uVar8 < (uint)uVar12);
        }
      }
      pbVar10 = (byte *)argtable[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while ((*pbVar10 & 1) == 0);
  }
  arg_dstr_cat(ds,"\n");
  return;
}

Assistant:

void arg_print_glossary_gnu_ds(arg_dstr_t ds, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;

            if (!shortopts && longopts) {
                /* Indent trailing line by 4 spaces... */
                memset(syntax, ' ', 4);
                *(syntax + 4) = '\0';
            }

            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");

            /* If syntax fits not into column, print glossary in new line... */
            if (strlen(syntax) > 25) {
                arg_dstr_catf(ds, "  %-25s %s\n", syntax, "");
                *syntax = '\0';
            }

            arg_dstr_catf(ds, "  %-25s ", syntax);
            arg_print_formatted_ds(ds, 28, 79, glossary);
        }
    } /* for each table entry */

    arg_dstr_cat(ds, "\n");
}